

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry_impl.hpp
# Opt level: O1

void hiberlite::Registry<A>::notifyRBDies(rb_pair<A> *r)

{
  int *piVar1;
  real_bean<A> *prVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>,_std::_Rb_tree_iterator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>_>
  pVar3;
  key_type local_28;
  
  prVar2 = (r->super_shared_cnt_obj_pair<hiberlite::real_bean<A>_>).res;
  local_28.id = (prVar2->key).id;
  local_28.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d4578;
  local_28.con.res = (prVar2->key).con.res;
  if (local_28.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_28.con.res)->refCount = (local_28.con.res)->refCount + 1;
  }
  pVar3 = std::
          _Rb_tree<hiberlite::bean_key,_std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>,_std::_Select1st<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>_>
          ::equal_range((_Rb_tree<hiberlite::bean_key,_std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>,_std::_Select1st<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>_>
                         *)rbpairs,&local_28);
  std::
  _Rb_tree<hiberlite::bean_key,_std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>,_std::_Select1st<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>_>
  ::_M_erase_aux((_Rb_tree<hiberlite::bean_key,_std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>,_std::_Select1st<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>_>
                  *)rbpairs,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node);
  local_28.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d4578;
  if (local_28.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &(local_28.con.res)->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_28.con.res)->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  return;
}

Assistant:

bean_key rb_pair<C>::get_key()
{
	return shared_cnt_obj_pair< real_bean<C> >::res->get_key();
}